

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m2v_basic.c
# Opt level: O2

_Bool mptest_clear_row(int nrow,int ncol,m256v *Ml,m2v *Ms)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  
  iVar2 = 7;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    iVar1 = rand();
    m256v_clear_row(Ml,iVar1 % nrow);
    m2v_clear_row(Ms,iVar1 % nrow);
  }
  return true;
}

Assistant:

static bool mptest_clear_row(int nrow, int ncol, m256v* Ml, m2v* Ms)
{
	for (int i = 0; i < 7; ++i) {
		const int r = rand() % nrow;

		m256v_clear_row(Ml, r);
		m2v_clear_row(Ms, r);
	}
	return true;
}